

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O2

bool __thiscall re2::Prog::IsOnePass(Prog *this)

{
  int *piVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  EmptyOp EVar8;
  int iVar9;
  int iVar10;
  ostream *this_00;
  int b;
  size_type __n;
  long lVar11;
  _Head_base<0UL,_int_*,_false> _Var12;
  ulong uVar13;
  EmptyOp EVar14;
  uint uVar15;
  long lVar16;
  EmptyOp *pEVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  Inst *pIVar21;
  bool bVar22;
  EmptyOp local_278;
  ulong local_270;
  PODArray<int> nodebyid;
  vector<unsigned_char,_std::allocator<unsigned_char>_> nodes;
  PODArray<re2::InstCond> stack;
  int local_210;
  Instq workq;
  Instq tovisit;
  LogMessage local_1b0;
  
  if (this->did_onepass_ == true) {
    bVar22 = (this->onepass_nodes_).ptr_._M_t.
             super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0;
  }
  else {
    this->did_onepass_ = true;
    if ((this->start_ != 0) && ((long)this->inst_count_[2] < 0xfde6)) {
      lVar16 = (long)this->inst_count_[2] + 2;
      iVar2 = this->bytemap_range_ * 4 + 4;
      __n = (size_type)iVar2;
      if (lVar16 <= (this->dfa_mem_ / 4) / (long)__n) {
        PODArray<re2::InstCond>::PODArray
                  (&stack,this->inst_count_[6] + this->inst_count_[3] + this->inst_count_[4] + 1);
        iVar10 = this->size_;
        PODArray<int>::PODArray(&nodebyid,iVar10);
        memset(nodebyid.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
               super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl,0xff,(long)iVar10 << 2);
        nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SparseSetT<void>::SparseSetT(&tovisit,iVar10);
        SparseSetT<void>::SparseSetT(&workq,iVar10);
        AddQ(&tovisit,this->start_);
        nodebyid.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl[this->start_] = 0;
        local_1b0.flushed_ = false;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                  (&nodes,(const_iterator)
                          nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish,__n,&local_1b0.flushed_);
        iVar10 = 1;
        _Var12 = tovisit.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>;
LAB_001db82c:
        piVar1 = tovisit.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl + tovisit.size_;
        if (_Var12._M_head_impl == piVar1) {
          iVar10 = iVar10 * iVar2;
          this->dfa_mem_ = this->dfa_mem_ - (long)iVar10;
          PODArray<unsigned_char>::PODArray((PODArray<unsigned_char> *)&local_1b0,iVar10);
          std::__uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>::operator=
                    ((__uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter> *)
                     &this->onepass_nodes_,
                     (__uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter> *)
                     &local_1b0);
          std::unique_ptr<unsigned_char[],_re2::PODArray<unsigned_char>::Deleter>::~unique_ptr
                    ((unique_ptr<unsigned_char[],_re2::PODArray<unsigned_char>::Deleter> *)
                     &local_1b0);
          memmove((this->onepass_nodes_).ptr_._M_t.
                  super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                  nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start,(long)iVar10);
LAB_001dbc28:
          SparseSetT<void>::~SparseSetT(&workq);
          SparseSetT<void>::~SparseSetT(&tovisit);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          std::unique_ptr<int[],_re2::PODArray<int>::Deleter>::~unique_ptr(&nodebyid.ptr_);
          std::unique_ptr<re2::InstCond[],_re2::PODArray<re2::InstCond>::Deleter>::~unique_ptr
                    (&stack.ptr_);
          return _Var12._M_head_impl == piVar1;
        }
        iVar7 = *_Var12._M_head_impl;
        iVar4 = nodebyid.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                super__Head_base<0UL,_int_*,_false>._M_head_impl[iVar7];
        pEVar17 = (EmptyOp *)
                  (nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar4 * iVar2);
        for (lVar11 = 0; lVar11 < this->bytemap_range_; lVar11 = lVar11 + 1) {
          pEVar17[lVar11 + 1] = kEmptyNonWordBoundary|kEmptyWordBoundary;
        }
        *pEVar17 = kEmptyNonWordBoundary|kEmptyWordBoundary;
        workq.size_ = 0;
        (stack.ptr_._M_t.super___uniq_ptr_impl<re2::InstCond,_re2::PODArray<re2::InstCond>::Deleter>
         ._M_t.super__Tuple_impl<0UL,_re2::InstCond_*,_re2::PODArray<re2::InstCond>::Deleter>.
         super__Head_base<0UL,_re2::InstCond_*,_false>._M_head_impl)->id = iVar7;
        (stack.ptr_._M_t.super___uniq_ptr_impl<re2::InstCond,_re2::PODArray<re2::InstCond>::Deleter>
         ._M_t.super__Tuple_impl<0UL,_re2::InstCond_*,_re2::PODArray<re2::InstCond>::Deleter>.
         super__Head_base<0UL,_re2::InstCond_*,_false>._M_head_impl)->cond = 0;
        bVar22 = false;
        local_270 = 1;
LAB_001db8aa:
        if (0 < (int)local_270) {
          local_270 = (ulong)((int)local_270 - 1);
          uVar18 = stack.ptr_._M_t.
                   super___uniq_ptr_impl<re2::InstCond,_re2::PODArray<re2::InstCond>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_re2::InstCond_*,_re2::PODArray<re2::InstCond>::Deleter>.
                   super__Head_base<0UL,_re2::InstCond_*,_false>._M_head_impl[local_270].id;
          local_278 = stack.ptr_._M_t.
                      super___uniq_ptr_impl<re2::InstCond,_re2::PODArray<re2::InstCond>::Deleter>.
                      _M_t.
                      super__Tuple_impl<0UL,_re2::InstCond_*,_re2::PODArray<re2::InstCond>::Deleter>
                      .super__Head_base<0UL,_re2::InstCond_*,_false>._M_head_impl[local_270].cond;
LAB_001db8c9:
          lVar11 = (long)(int)uVar18 << 3;
          do {
            uVar18 = uVar18 + 1;
            pIVar21 = (this->inst_).ptr_._M_t.
                      super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                      .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
            uVar15 = *(uint *)((long)&pIVar21->out_opcode_ + lVar11);
            switch(uVar15 & 7) {
            case 0:
              LogMessage::LogMessage
                        (&local_1b0,
                         "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/re2-src/re2/onepass.cc"
                         ,0x1bf);
              this_00 = std::operator<<(&local_1b0.str_.
                                         super_basic_ostream<char,_std::char_traits<char>_>,
                                        "unhandled opcode: ");
              std::ostream::operator<<(this_00,*(uint *)((long)&pIVar21->out_opcode_ + lVar11) & 7);
              LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
            case 1:
              if ((uVar15 & 8) != 0) {
                __assert_fail("!ip->last()",
                              "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/re2-src/re2/onepass.cc"
                              ,0x1c5,"bool re2::Prog::IsOnePass()");
              }
              bVar6 = AddQ(&workq,uVar18);
              lVar11 = lVar11 + 8;
              if (!bVar6) goto LAB_001dbc28;
              break;
            case 2:
              goto switchD_001db8ee_caseD_2;
            default:
              pIVar21 = (Inst *)((long)&pIVar21->out_opcode_ + lVar11);
              if ((uVar15 & 8) == 0) {
                bVar6 = AddQ(&workq,uVar18);
                if (!bVar6) goto LAB_001dbc28;
                lVar11 = (long)(int)local_270;
                stack.ptr_._M_t.
                super___uniq_ptr_impl<re2::InstCond,_re2::PODArray<re2::InstCond>::Deleter>._M_t.
                super__Tuple_impl<0UL,_re2::InstCond_*,_re2::PODArray<re2::InstCond>::Deleter>.
                super__Head_base<0UL,_re2::InstCond_*,_false>._M_head_impl[lVar11].id = uVar18;
                local_270 = (ulong)((int)local_270 + 1);
                stack.ptr_._M_t.
                super___uniq_ptr_impl<re2::InstCond,_re2::PODArray<re2::InstCond>::Deleter>._M_t.
                super__Tuple_impl<0UL,_re2::InstCond_*,_re2::PODArray<re2::InstCond>::Deleter>.
                super__Head_base<0UL,_re2::InstCond_*,_false>._M_head_impl[lVar11].cond = local_278;
                uVar15 = pIVar21->out_opcode_;
              }
              if (((uVar15 & 7) == 3) && (iVar7 = Inst::cap(pIVar21), iVar7 < 10)) {
                iVar7 = Inst::cap(pIVar21);
                local_278 = local_278 | 0x20 << ((byte)iVar7 & 0x1f);
              }
              uVar18 = pIVar21->out_opcode_;
              if ((uVar18 & 7) == 4) {
                EVar8 = Inst::empty(pIVar21);
                local_278 = local_278 | EVar8;
                uVar18 = pIVar21->out_opcode_;
              }
              bVar6 = AddQ(&workq,uVar18 >> 4);
              if (!bVar6) goto LAB_001dbc28;
              uVar18 = pIVar21->out_opcode_ >> 4;
              goto LAB_001db8c9;
            case 5:
              if (bVar22) goto LAB_001dbc28;
              *pEVar17 = local_278;
              if ((*(byte *)((long)&pIVar21->out_opcode_ + lVar11) & 8) == 0) {
                bVar6 = AddQ(&workq,uVar18);
                bVar22 = true;
                goto LAB_001dbb9a;
              }
              bVar22 = true;
            case 7:
              goto switchD_001db8ee_caseD_7;
            }
          } while( true );
        }
        _Var12._M_head_impl = _Var12._M_head_impl + 1;
        goto LAB_001db82c;
      }
    }
    bVar22 = false;
  }
  return bVar22;
switchD_001db8ee_caseD_2:
  pIVar21 = (Inst *)((long)&pIVar21->out_opcode_ + lVar11);
  iVar7 = nodebyid.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
          super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl[uVar15 >> 4];
  if (nodebyid.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
      super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl[uVar15 >> 4] == -1) {
    local_210 = (int)lVar16;
    if (local_210 <= iVar10) goto LAB_001dbc28;
    AddQ(&tovisit,uVar15 >> 4);
    nodebyid.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
    super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl[pIVar21->out_opcode_ >> 4] = iVar10;
    local_1b0.flushed_ = false;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
              (&nodes,(const_iterator)
                      nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish,__n,&local_1b0.flushed_);
    pEVar17 = (EmptyOp *)
              (nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + iVar4 * iVar2);
    iVar7 = iVar10;
    iVar10 = iVar10 + 1;
  }
  iVar9 = Inst::lo(pIVar21);
  EVar14 = iVar7 << 0x10 | local_278;
  EVar8 = EVar14 | 0x40;
  if (!bVar22) {
    EVar8 = EVar14;
  }
  for (; iVar7 = Inst::hi(pIVar21), iVar9 <= iVar7; iVar9 = iVar9 + 1) {
    bVar3 = this->bytemap_[iVar9];
    iVar7 = 0xff;
    if (0xff < iVar9) {
      iVar7 = iVar9;
    }
    iVar19 = iVar9 + -1;
    lVar11 = (long)iVar9;
    do {
      iVar9 = iVar7;
      if (0xfe < lVar11) break;
      iVar19 = iVar19 + 1;
      lVar5 = lVar11 + 1;
      lVar11 = lVar11 + 1;
      iVar9 = iVar19;
    } while (this->bytemap_[lVar5] == bVar3);
    if ((~pEVar17[(ulong)bVar3 + 1] & 0x30) == 0) {
      pEVar17[(ulong)bVar3 + 1] = EVar8;
    }
    else if (pEVar17[(ulong)bVar3 + 1] != EVar8) goto LAB_001dbc28;
  }
  iVar7 = Inst::foldcase(pIVar21);
  if (iVar7 != 0) {
    iVar7 = Inst::lo(pIVar21);
    if (iVar7 < 0x62) {
      iVar7 = 0x61;
    }
    uVar20 = (ulong)(iVar7 - 0x20);
    iVar7 = Inst::hi(pIVar21);
    if (0x79 < iVar7) {
      iVar7 = 0x7a;
    }
    while (iVar9 = (int)uVar20, iVar9 <= iVar7 + -0x20) {
      bVar3 = this->bytemap_[iVar9];
      uVar13 = (long)iVar9;
      do {
        if (0xfe < (long)uVar13) {
          uVar20 = 0x100;
          break;
        }
        uVar20 = uVar13 + 1;
        lVar11 = uVar13 + 1;
        uVar13 = uVar20;
      } while (this->bytemap_[lVar11] == bVar3);
      if ((~pEVar17[(ulong)bVar3 + 1] & 0x30) == 0) {
        pEVar17[(ulong)bVar3 + 1] = EVar8;
      }
      else if (pEVar17[(ulong)bVar3 + 1] != EVar8) goto LAB_001dbc28;
    }
  }
  if ((pIVar21->out_opcode_ & 8) != 0) goto switchD_001db8ee_caseD_7;
  bVar6 = AddQ(&workq,uVar18);
LAB_001dbb9a:
  if (bVar6 == false) goto LAB_001dbc28;
  goto LAB_001db8c9;
switchD_001db8ee_caseD_7:
  goto LAB_001db8aa;
}

Assistant:

bool Prog::IsOnePass() {
  if (did_onepass_)
    return onepass_nodes_.data() != NULL;
  did_onepass_ = true;

  if (start() == 0)  // no match
    return false;

  // Steal memory for the one-pass NFA from the overall DFA budget.
  // Willing to use at most 1/4 of the DFA budget (heuristic).
  // Limit max node count to 65000 as a conservative estimate to
  // avoid overflowing 16-bit node index in encoding.
  int maxnodes = 2 + inst_count(kInstByteRange);
  int statesize = sizeof(OneState) + bytemap_range()*sizeof(uint32_t);
  if (maxnodes >= 65000 || dfa_mem_ / 4 / statesize < maxnodes)
    return false;

  // Flood the graph starting at the start state, and check
  // that in each reachable state, each possible byte leads
  // to a unique next state.
  int stacksize = inst_count(kInstCapture) +
                  inst_count(kInstEmptyWidth) +
                  inst_count(kInstNop) + 1;  // + 1 for start inst
  PODArray<InstCond> stack(stacksize);

  int size = this->size();
  PODArray<int> nodebyid(size);  // indexed by ip
  memset(nodebyid.data(), 0xFF, size*sizeof nodebyid[0]);

  // Originally, nodes was a uint8_t[maxnodes*statesize], but that was
  // unnecessarily optimistic: why allocate a large amount of memory
  // upfront for a large program when it is unlikely to be one-pass?
  std::vector<uint8_t> nodes;

  Instq tovisit(size), workq(size);
  AddQ(&tovisit, start());
  nodebyid[start()] = 0;
  int nalloc = 1;
  nodes.insert(nodes.end(), statesize, 0);
  for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
    int id = *it;
    int nodeindex = nodebyid[id];
    OneState* node = IndexToNode(nodes.data(), statesize, nodeindex);

    // Flood graph using manual stack, filling in actions as found.
    // Default is none.
    for (int b = 0; b < bytemap_range_; b++)
      node->action[b] = kImpossible;
    node->matchcond = kImpossible;

    workq.clear();
    bool matched = false;
    int nstack = 0;
    stack[nstack].id = id;
    stack[nstack++].cond = 0;
    while (nstack > 0) {
      int id = stack[--nstack].id;
      uint32_t cond = stack[nstack].cond;

    Loop:
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
          break;

        case kInstAltMatch:
          // TODO(rsc): Ignoring kInstAltMatch optimization.
          // Should implement it in this engine, but it's subtle.
          DCHECK(!ip->last());
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstByteRange: {
          int nextindex = nodebyid[ip->out()];
          if (nextindex == -1) {
            if (nalloc >= maxnodes) {
              if (ExtraDebug)
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: hit node limit %d >= %d", nalloc, maxnodes);
              goto fail;
            }
            nextindex = nalloc;
            AddQ(&tovisit, ip->out());
            nodebyid[ip->out()] = nalloc;
            nalloc++;
            nodes.insert(nodes.end(), statesize, 0);
            // Update node because it might have been invalidated.
            node = IndexToNode(nodes.data(), statesize, nodeindex);
          }
          for (int c = ip->lo(); c <= ip->hi(); c++) {
            int b = bytemap_[c];
            // Skip any bytes immediately after c that are also in b.
            while (c < 256-1 && bytemap_[c+1] == b)
              c++;
            uint32_t act = node->action[b];
            uint32_t newact = (nextindex << kIndexShift) | cond;
            if (matched)
              newact |= kMatchWins;
            if ((act & kImpossible) == kImpossible) {
              node->action[b] = newact;
            } else if (act != newact) {
              if (ExtraDebug)
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: conflict on byte %#x at state %d", c, *it);
              goto fail;
            }
          }
          if (ip->foldcase()) {
            Rune lo = std::max<Rune>(ip->lo(), 'a') + 'A' - 'a';
            Rune hi = std::min<Rune>(ip->hi(), 'z') + 'A' - 'a';
            for (int c = lo; c <= hi; c++) {
              int b = bytemap_[c];
              // Skip any bytes immediately after c that are also in b.
              while (c < 256-1 && bytemap_[c+1] == b)
                c++;
              uint32_t act = node->action[b];
              uint32_t newact = (nextindex << kIndexShift) | cond;
              if (matched)
                newact |= kMatchWins;
              if ((act & kImpossible) == kImpossible) {
                node->action[b] = newact;
              } else if (act != newact) {
                if (ExtraDebug)
                  LOG(ERROR) << StringPrintf(
                      "Not OnePass: conflict on byte %#x at state %d", c, *it);
                goto fail;
              }
            }
          }

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;
        }

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last()) {
            // If already on work queue, (1) is violated: bail out.
            if (!AddQ(&workq, id+1))
              goto fail;
            stack[nstack].id = id+1;
            stack[nstack++].cond = cond;
          }

          if (ip->opcode() == kInstCapture && ip->cap() < kMaxCap)
            cond |= (1 << kCapShift) << ip->cap();
          if (ip->opcode() == kInstEmptyWidth)
            cond |= ip->empty();

          // kInstCapture and kInstNop always proceed to ip->out().
          // kInstEmptyWidth only sometimes proceeds to ip->out(),
          // but as a conservative approximation we assume it always does.
          // We could be a little more precise by looking at what c
          // is, but that seems like overkill.

          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, ip->out())) {
            if (ExtraDebug)
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple paths %d -> %d", *it, ip->out());
            goto fail;
          }
          id = ip->out();
          goto Loop;

        case kInstMatch:
          if (matched) {
            // (3) is violated
            if (ExtraDebug)
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple matches from %d", *it);
            goto fail;
          }
          matched = true;
          node->matchcond = cond;

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstFail:
          break;
      }
    }
  }

  if (ExtraDebug) {  // For debugging, dump one-pass NFA to LOG(ERROR).
    LOG(ERROR) << "bytemap:\n" << DumpByteMap();
    LOG(ERROR) << "prog:\n" << Dump();

    std::map<int, int> idmap;
    for (int i = 0; i < size; i++)
      if (nodebyid[i] != -1)
        idmap[nodebyid[i]] = i;

    std::string dump;
    for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
      int id = *it;
      int nodeindex = nodebyid[id];
      if (nodeindex == -1)
        continue;
      OneState* node = IndexToNode(nodes.data(), statesize, nodeindex);
      dump += StringPrintf("node %d id=%d: matchcond=%#x\n",
                           nodeindex, id, node->matchcond);
      for (int i = 0; i < bytemap_range_; i++) {
        if ((node->action[i] & kImpossible) == kImpossible)
          continue;
        dump += StringPrintf("  %d cond %#x -> %d id=%d\n",
                             i, node->action[i] & 0xFFFF,
                             node->action[i] >> kIndexShift,
                             idmap[node->action[i] >> kIndexShift]);
      }
    }
    LOG(ERROR) << "nodes:\n" << dump;
  }

  dfa_mem_ -= nalloc*statesize;
  onepass_nodes_ = PODArray<uint8_t>(nalloc*statesize);
  memmove(onepass_nodes_.data(), nodes.data(), nalloc*statesize);
  return true;

fail:
  return false;
}